

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O2

uint8_t * __thiscall
proto2_unittest::TestNestedMessageHasBits_NestedMessage::_InternalSerialize
          (TestNestedMessageHasBits_NestedMessage *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  ulong uVar1;
  int iVar2;
  uint8_t *puVar3;
  const_reference piVar4;
  Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest::ForeignMessage>_> *value;
  int iVar5;
  
  iVar2 = google::protobuf::RepeatedField<int>::size
                    (&(this->field_0)._impl_.nestedmessage_repeated_int32_);
  iVar5 = 0;
  if (iVar2 < 1) {
    iVar2 = 0;
  }
  for (; iVar2 != iVar5; iVar5 = iVar5 + 1) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    piVar4 = google::protobuf::RepeatedField<int>::Get
                       (&(this->field_0)._impl_.nestedmessage_repeated_int32_,iVar5);
    target = google::protobuf::internal::WireFormatLite::WriteInt32ToArray(1,*piVar4,puVar3);
  }
  iVar2 = *(int *)((long)&this->field_0 + 0x18);
  for (iVar5 = 0; iVar2 != iVar5; iVar5 = iVar5 + 1) {
    value = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::internal::GenericTypeHandler<proto2_unittest::ForeignMessage>>
                      (&(this->field_0)._impl_.nestedmessage_repeated_foreignmessage_.
                        super_RepeatedPtrFieldBase,iVar5);
    target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (2,(MessageLite *)value,(value->field_0)._impl_._cached_size_.atom_,target,
                        stream);
  }
  uVar1 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    puVar3 = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((uVar1 & 0xfffffffffffffffe) + 8),target,stream);
    return puVar3;
  }
  return target;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestNestedMessageHasBits_NestedMessage::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestNestedMessageHasBits_NestedMessage& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.TestNestedMessageHasBits.NestedMessage)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // repeated int32 nestedmessage_repeated_int32 = 1;
  for (int i = 0, n = this_._internal_nestedmessage_repeated_int32_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteInt32ToArray(
        1, this_._internal_nestedmessage_repeated_int32().Get(i), target);
  }

  // repeated .proto2_unittest.ForeignMessage nestedmessage_repeated_foreignmessage = 2;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_nestedmessage_repeated_foreignmessage_size());
       i < n; i++) {
    const auto& repfield = this_._internal_nestedmessage_repeated_foreignmessage().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            2, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.TestNestedMessageHasBits.NestedMessage)
  return target;
}